

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynTypedef * ParseTypedef(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *pLVar2;
  Lexeme *end;
  SynIdentifier *pSVar3;
  InplaceStr local_60;
  char *local_50;
  char *local_48;
  undefined1 local_40 [8];
  InplaceStr alias;
  SynIdentifier *aliasIdentifier;
  SynBase *type;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_typedef);
  if (bVar1) {
    aliasIdentifier = (SynIdentifier *)ParseType(ctx,(bool *)0x0,false);
    if (aliasIdentifier == (SynIdentifier *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar2,"ERROR: typename expected after typedef");
      aliasIdentifier = (SynIdentifier *)ParseContext::get<SynError>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynError::SynError((SynError *)aliasIdentifier,begin,pLVar2);
    }
    alias.end = (char *)0x0;
    bVar1 = anon_unknown.dwarf_fc7e::CheckAt
                      (ctx,lex_string,
                       "ERROR: alias name expected after typename in typedef expression");
    if (bVar1) {
      _local_40 = ParseContext::Consume(ctx);
      pSVar3 = ParseContext::get<SynIdentifier>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      end = ParseContext::Previous(ctx);
      local_50 = (char *)local_40;
      local_48 = alias.begin;
      SynIdentifier::SynIdentifier(pSVar3,pLVar2,end,_local_40);
      alias.end = (char *)pSVar3;
    }
    else {
      pSVar3 = ParseContext::get<SynIdentifier>(ctx);
      InplaceStr::InplaceStr(&local_60);
      SynIdentifier::SynIdentifier(pSVar3,local_60);
      alias.end = (char *)pSVar3;
    }
    anon_unknown.dwarf_fc7e::CheckConsume(ctx,lex_semicolon,"ERROR: \';\' not found after typedef");
    ctx_local = (ParseContext *)ParseContext::get<SynTypedef>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynTypedef::SynTypedef
              ((SynTypedef *)ctx_local,begin,pLVar2,&aliasIdentifier->super_SynBase,
               (SynIdentifier *)alias.end);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynTypedef *)ctx_local;
}

Assistant:

SynTypedef* ParseTypedef(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_typedef))
	{
		SynBase *type = ParseType(ctx);

		if(!type)
		{
			Report(ctx, ctx.Current(), "ERROR: typename expected after typedef");

			type = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		SynIdentifier *aliasIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: alias name expected after typename in typedef expression"))
		{
			InplaceStr alias = ctx.Consume();
			aliasIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias);
		}
		else
		{
			aliasIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after typedef");

		return new (ctx.get<SynTypedef>()) SynTypedef(start, ctx.Previous(), type, aliasIdentifier);
	}

	return NULL;
}